

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# searchIOF.cpp
# Opt level: O0

void printnode(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *c,datanode *node,int nsize)

{
  datanode *pdVar1;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  undefined4 local_20;
  int local_1c;
  int i;
  int nsize_local;
  datanode *node_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *c_local;
  
  local_20 = 0;
  local_1c = nsize;
  _i = node;
  node_local = (datanode *)c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40," ( ",&local_41);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(c,(value_type *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  print_IO(_i,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)node_local,local_1c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)node_local);
  pdVar1 = node_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,")",&local_79);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pdVar1,(value_type *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  pdVar1 = node_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"input Clk, Rst",&local_a1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pdVar1,(value_type *)local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  print_IOWG(_i,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)node_local,local_1c);
  pdVar1 = node_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,";",&local_c9);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pdVar1,(value_type *)local_c8);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return;
}

Assistant:

void printnode(vector<string> &c, struct datanode *node,int nsize)
{
	int i = 0;
	c.push_back(" ( ");
	print_IO(node, c,nsize);
	c.pop_back();
	c.push_back(")");
	c.push_back("input Clk, Rst");
	print_IOWG(node, c, nsize);
	c.push_back(";");

}